

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O0

void arm_v7m_cpu_do_interrupt_aarch64(CPUState *cs)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  CPUARMState_conflict *env_00;
  int local_2c;
  int target_secstate;
  _Bool ignore_stackfaults;
  uint32_t lr;
  CPUARMState_conflict *env;
  ARMCPU_conflict1 *cpu;
  CPUState *cs_local;
  
  env_00 = (CPUARMState_conflict *)(cs[1].tb_jmp_cache + 0x40b);
  switch(cs->exception_index) {
  case 1:
    armv7m_nvic_set_pending_aarch64
              (cs[1].tb_jmp_cache[0xa1f],6,*(int *)(cs[1].tb_jmp_cache + 0x57c) != 0);
    *(uint *)((long)cs[1].tb_jmp_cache + (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c)
         = *(uint *)((long)cs[1].tb_jmp_cache +
                    (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c) | 0x10000;
    break;
  case 2:
    armv7m_nvic_set_pending_aarch64
              (cs[1].tb_jmp_cache[0xa1f],0xb,*(int *)(cs[1].tb_jmp_cache + 0x57c) != 0);
    break;
  case 3:
  case 4:
    uVar2 = *(uint *)((long)cs[1].tb_jmp_cache + 0x2c2c) & 0xf;
    if (uVar2 == 8) {
      if (cs->exception_index == 3) {
        *(uint *)((long)cs[1].tb_jmp_cache + 0x2b9c) =
             *(uint *)((long)cs[1].tb_jmp_cache + 0x2b9c) | 0x100;
      }
      else if (cs->exception_index == 4) {
        *(uint *)((long)cs[1].tb_jmp_cache + 0x2b9c) =
             *(uint *)((long)cs[1].tb_jmp_cache + 0x2b9c) | 0x8200;
        *(int *)(cs[1].tb_jmp_cache + 0x577) = (int)cs[1].tb_jmp_cache[0x586];
      }
      armv7m_nvic_set_pending_aarch64(cs[1].tb_jmp_cache[0xa1f],5,false);
    }
    else if (uVar2 == 0xe) {
      if (cs->exception_index == 3) {
        if (*(int *)(cs[1].tb_jmp_cache + 0x57c) == 0) {
          *(uint *)((long)cs[1].tb_jmp_cache + 0x2bac) =
               *(uint *)((long)cs[1].tb_jmp_cache + 0x2bac) | 1;
        }
        else {
          *(uint *)((long)cs[1].tb_jmp_cache + 0x2bac) =
               *(uint *)((long)cs[1].tb_jmp_cache + 0x2bac) | 0x10;
        }
      }
      else if (cs->exception_index == 4) {
        *(uint *)((long)cs[1].tb_jmp_cache + 0x2bac) =
             *(uint *)((long)cs[1].tb_jmp_cache + 0x2bac) | 8;
      }
      armv7m_nvic_set_pending_aarch64(cs[1].tb_jmp_cache[0xa1f],7,false);
    }
    else if (uVar2 == 0xf) {
      _Var1 = v7m_handle_execute_nsc((ARMCPU_conflict1 *)cs);
      if (_Var1) {
        return;
      }
    }
    else {
      if (cs->exception_index == 3) {
        *(uint *)((long)cs[1].tb_jmp_cache +
                 (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c) =
             *(uint *)((long)cs[1].tb_jmp_cache +
                      (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c) | 1;
      }
      else if (cs->exception_index == 4) {
        *(uint *)((long)cs[1].tb_jmp_cache +
                 (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c) =
             *(uint *)((long)cs[1].tb_jmp_cache +
                      (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c) | 0x82;
        *(int *)((long)cs[1].tb_jmp_cache +
                (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2bb0) =
             (int)cs[1].tb_jmp_cache[0x586];
      }
      armv7m_nvic_set_pending_aarch64
                (cs[1].tb_jmp_cache[0xa1f],4,*(int *)(cs[1].tb_jmp_cache + 0x57c) != 0);
    }
    break;
  case 5:
    break;
  default:
    cpu_abort_aarch64(cs,"Unhandled exception 0x%x\n",(ulong)(uint)cs->exception_index);
  case 7:
    armv7m_nvic_set_pending_aarch64(cs[1].tb_jmp_cache[0xa1f],0xc,false);
    break;
  case 8:
    if (0xfeffffff < *(uint *)((long)cs[1].tb_jmp_cache + 0x2094)) {
      do_v7m_exception_exit((ARMCPU_conflict1 *)cs);
      return;
    }
    if (*(uint *)((long)cs[1].tb_jmp_cache + 0x2094) < 0xfefffffe) {
      __assert_fail("env->regs[15] >= FNC_RETURN_MIN_MAGIC",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                    ,0x856,"void arm_v7m_cpu_do_interrupt_aarch64(CPUState *)");
    }
    iVar3 = arm_feature(env_00,0x25);
    if (iVar3 == 0) {
      __assert_fail("arm_feature(env, ARM_FEATURE_M_SECURITY)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/m_helper.c"
                    ,0x857,"void arm_v7m_cpu_do_interrupt_aarch64(CPUState *)");
    }
    _Var1 = do_v7m_function_return((ARMCPU_conflict1 *)cs);
    if (_Var1) {
      return;
    }
    break;
  case 0x10:
    iVar3 = 4;
    if (*(int *)(cs[1].tb_jmp_cache + 0x44f) != 0) {
      iVar3 = 2;
    }
    *(int *)((long)cs[1].tb_jmp_cache + 0x2094) =
         iVar3 + *(int *)((long)cs[1].tb_jmp_cache + 0x2094);
    return;
  case 0x11:
    if (*(int *)(cs[1].tb_jmp_cache + 0x587) == 3) {
      local_2c = 1;
    }
    else {
      local_2c = *(int *)(cs[1].tb_jmp_cache + 0x57c);
    }
    armv7m_nvic_set_pending_aarch64(cs[1].tb_jmp_cache[0xa1f],6,local_2c != 0);
    *(uint *)((long)cs[1].tb_jmp_cache + (long)local_2c * 4 + 0x2b9c) =
         *(uint *)((long)cs[1].tb_jmp_cache + (long)local_2c * 4 + 0x2b9c) | 0x80000;
    break;
  case 0x12:
    armv7m_nvic_set_pending_aarch64
              (cs[1].tb_jmp_cache[0xa1f],6,*(int *)(cs[1].tb_jmp_cache + 0x57c) != 0);
    *(uint *)((long)cs[1].tb_jmp_cache + (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c)
         = *(uint *)((long)cs[1].tb_jmp_cache +
                    (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c) | 0x20000;
    break;
  case 0x13:
    armv7m_nvic_set_pending_aarch64
              (cs[1].tb_jmp_cache[0xa1f],6,*(int *)(cs[1].tb_jmp_cache + 0x57c) != 0);
    *(uint *)((long)cs[1].tb_jmp_cache + (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c)
         = *(uint *)((long)cs[1].tb_jmp_cache +
                    (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c) | 0x100000;
    break;
  case 0x14:
    break;
  case 0x15:
    armv7m_nvic_set_pending_aarch64(cs[1].tb_jmp_cache[0xa1f],7,false);
    *(uint *)((long)cs[1].tb_jmp_cache + 0x2bac) =
         *(uint *)((long)cs[1].tb_jmp_cache + 0x2bac) | 0x80;
    break;
  case 0x16:
    armv7m_nvic_set_pending_aarch64
              (cs[1].tb_jmp_cache[0xa1f],6,*(int *)(cs[1].tb_jmp_cache + 0x57c) != 0);
    *(uint *)((long)cs[1].tb_jmp_cache + (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c)
         = *(uint *)((long)cs[1].tb_jmp_cache +
                    (ulong)*(uint *)(cs[1].tb_jmp_cache + 0x57c) * 4 + 0x2b9c) | 0x1000000;
  }
  iVar3 = arm_feature(env_00,0x1b);
  if (iVar3 == 0) {
    target_secstate = -0x1f;
    if ((*(uint *)((long)cs[1].tb_jmp_cache + 0x2b8c) & 2) != 0) {
      target_secstate = -0x1b;
    }
  }
  else {
    target_secstate = -0x60;
    if (*(int *)(cs[1].tb_jmp_cache + 0x57c) != 0) {
      target_secstate = -0x20;
    }
  }
  if (((ulong)cs[1].tb_jmp_cache[0x572] & 4) == 0) {
    target_secstate = target_secstate | 0x10;
  }
  _Var1 = arm_v7m_is_handler_mode(env_00);
  if (!_Var1) {
    target_secstate = target_secstate | 8;
  }
  _Var1 = v7m_push_stack((ARMCPU_conflict1 *)cs);
  v7m_exception_taken((ARMCPU_conflict1 *)cs,target_secstate,false,_Var1);
  return;
}

Assistant:

void arm_v7m_cpu_do_interrupt(CPUState *cs)
{
    ARMCPU *cpu = ARM_CPU(cs);
    CPUARMState *env = &cpu->env;
    uint32_t lr;
    bool ignore_stackfaults;

    // arm_log_exception(cs->exception_index);

    /*
     * For exceptions we just mark as pending on the NVIC, and let that
     * handle it.
     */
    switch (cs->exception_index) {
    case EXCP_UDEF:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, env->v7m.secure);
        env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_UNDEFINSTR_MASK;
        break;
    case EXCP_NOCP:
    {
        /*
         * NOCP might be directed to something other than the current
         * security state if this fault is because of NSACR; we indicate
         * the target security state using exception.target_el.
         */
        int target_secstate;

        if (env->exception.target_el == 3) {
            target_secstate = M_REG_S;
        } else {
            target_secstate = env->v7m.secure;
        }
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, target_secstate);
        env->v7m.cfsr[target_secstate] |= R_V7M_CFSR_NOCP_MASK;
        break;
    }
    case EXCP_INVSTATE:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, env->v7m.secure);
        env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_INVSTATE_MASK;
        break;
    case EXCP_STKOF:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, env->v7m.secure);
        env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_STKOF_MASK;
        break;
    case EXCP_LSERR:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_SECURE, false);
        env->v7m.sfsr |= R_V7M_SFSR_LSERR_MASK;
        break;
    case EXCP_UNALIGNED:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_USAGE, env->v7m.secure);
        env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_UNALIGNED_MASK;
        break;
    case EXCP_SWI:
        /* The PC already points to the next instruction.  */
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_SVC, env->v7m.secure);
        break;
    case EXCP_PREFETCH_ABORT:
    case EXCP_DATA_ABORT:
        /*
         * Note that for M profile we don't have a guest facing FSR, but
         * the env->exception.fsr will be populated by the code that
         * raises the fault, in the A profile short-descriptor format.
         */
        switch (env->exception.fsr & 0xf) {
        case M_FAKE_FSR_NSC_EXEC:
            /*
             * Exception generated when we try to execute code at an address
             * which is marked as Secure & Non-Secure Callable and the CPU
             * is in the Non-Secure state. The only instruction which can
             * be executed like this is SG (and that only if both halves of
             * the SG instruction have the same security attributes.)
             * Everything else must generate an INVEP SecureFault, so we
             * emulate the SG instruction here.
             */
            if (v7m_handle_execute_nsc(cpu)) {
                return;
            }
            break;
        case M_FAKE_FSR_SFAULT:
            /*
             * Various flavours of SecureFault for attempts to execute or
             * access data in the wrong security state.
             */
            switch (cs->exception_index) {
            case EXCP_PREFETCH_ABORT:
                if (env->v7m.secure) {
                    env->v7m.sfsr |= R_V7M_SFSR_INVTRAN_MASK;
                    qemu_log_mask(CPU_LOG_INT,
                                  "...really SecureFault with SFSR.INVTRAN\n");
                } else {
                    env->v7m.sfsr |= R_V7M_SFSR_INVEP_MASK;
                    qemu_log_mask(CPU_LOG_INT,
                                  "...really SecureFault with SFSR.INVEP\n");
                }
                break;
            case EXCP_DATA_ABORT:
                /* This must be an NS access to S memory */
                env->v7m.sfsr |= R_V7M_SFSR_AUVIOL_MASK;
                qemu_log_mask(CPU_LOG_INT,
                              "...really SecureFault with SFSR.AUVIOL\n");
                break;
            }
            armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_SECURE, false);
            break;
        case 0x8: /* External Abort */
            switch (cs->exception_index) {
            case EXCP_PREFETCH_ABORT:
                env->v7m.cfsr[M_REG_NS] |= R_V7M_CFSR_IBUSERR_MASK;
                qemu_log_mask(CPU_LOG_INT, "...with CFSR.IBUSERR\n");
                break;
            case EXCP_DATA_ABORT:
                env->v7m.cfsr[M_REG_NS] |=
                    (R_V7M_CFSR_PRECISERR_MASK | R_V7M_CFSR_BFARVALID_MASK);
                env->v7m.bfar = env->exception.vaddress;
                qemu_log_mask(CPU_LOG_INT,
                              "...with CFSR.PRECISERR and BFAR 0x%x\n",
                              env->v7m.bfar);
                break;
            }
            armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_BUS, false);
            break;
        default:
            /*
             * All other FSR values are either MPU faults or "can't happen
             * for M profile" cases.
             */
            switch (cs->exception_index) {
            case EXCP_PREFETCH_ABORT:
                env->v7m.cfsr[env->v7m.secure] |= R_V7M_CFSR_IACCVIOL_MASK;
                qemu_log_mask(CPU_LOG_INT, "...with CFSR.IACCVIOL\n");
                break;
            case EXCP_DATA_ABORT:
                env->v7m.cfsr[env->v7m.secure] |=
                    (R_V7M_CFSR_DACCVIOL_MASK | R_V7M_CFSR_MMARVALID_MASK);
                env->v7m.mmfar[env->v7m.secure] = env->exception.vaddress;
                qemu_log_mask(CPU_LOG_INT,
                              "...with CFSR.DACCVIOL and MMFAR 0x%x\n",
                              env->v7m.mmfar[env->v7m.secure]);
                break;
            }
            armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_MEM,
                                    env->v7m.secure);
            break;
        }
        break;
    case EXCP_SEMIHOST:
        qemu_log_mask(CPU_LOG_INT,
                      "...handling as semihosting call 0x%x\n",
                      env->regs[0]);
        // env->regs[0] = do_arm_semihosting(env); FIXME
        env->regs[15] += env->thumb ? 2 : 4;
        return;
    case EXCP_BKPT:
        armv7m_nvic_set_pending(env->nvic, ARMV7M_EXCP_DEBUG, false);
        break;
    case EXCP_IRQ:
        break;
    case EXCP_EXCEPTION_EXIT:
        if (env->regs[15] < EXC_RETURN_MIN_MAGIC) {
            /* Must be v8M security extension function return */
            assert(env->regs[15] >= FNC_RETURN_MIN_MAGIC);
            assert(arm_feature(env, ARM_FEATURE_M_SECURITY));
            if (do_v7m_function_return(cpu)) {
                return;
            }
        } else {
            do_v7m_exception_exit(cpu);
            return;
        }
        break;
    case EXCP_LAZYFP:
        /*
         * We already pended the specific exception in the NVIC in the
         * v7m_preserve_fp_state() helper function.
         */
        break;
    default:
        cpu_abort(cs, "Unhandled exception 0x%x\n", cs->exception_index);
        return; /* Never happens.  Keep compiler happy.  */
    }

    if (arm_feature(env, ARM_FEATURE_V8)) {
        lr = R_V7M_EXCRET_RES1_MASK |
            R_V7M_EXCRET_DCRS_MASK;
        /*
         * The S bit indicates whether we should return to Secure
         * or NonSecure (ie our current state).
         * The ES bit indicates whether we're taking this exception
         * to Secure or NonSecure (ie our target state). We set it
         * later, in v7m_exception_taken().
         * The SPSEL bit is also set in v7m_exception_taken() for v8M.
         * This corresponds to the ARM ARM pseudocode for v8M setting
         * some LR bits in PushStack() and some in ExceptionTaken();
         * the distinction matters for the tailchain cases where we
         * can take an exception without pushing the stack.
         */
        if (env->v7m.secure) {
            lr |= R_V7M_EXCRET_S_MASK;
        }
    } else {
        lr = R_V7M_EXCRET_RES1_MASK |
            R_V7M_EXCRET_S_MASK |
            R_V7M_EXCRET_DCRS_MASK |
            R_V7M_EXCRET_ES_MASK;
        if (env->v7m.control[M_REG_NS] & R_V7M_CONTROL_SPSEL_MASK) {
            lr |= R_V7M_EXCRET_SPSEL_MASK;
        }
    }
    if (!(env->v7m.control[M_REG_S] & R_V7M_CONTROL_FPCA_MASK)) {
        lr |= R_V7M_EXCRET_FTYPE_MASK;
    }
    if (!arm_v7m_is_handler_mode(env)) {
        lr |= R_V7M_EXCRET_MODE_MASK;
    }

    ignore_stackfaults = v7m_push_stack(cpu);
    v7m_exception_taken(cpu, lr, false, ignore_stackfaults);
}